

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

re2 * __thiscall re2::FormatMode_abi_cxx11_(re2 *this,ParseFlags flags)

{
  int local_18;
  int i;
  ParseFlags flags_local;
  
  local_18 = 0;
  while( true ) {
    if (4 < local_18) {
      StringPrintf_abi_cxx11_((char *)this,"%#x",(ulong)flags);
      return this;
    }
    if (*(ParseFlags *)(parse_modes + (long)local_18 * 0x28) == flags) break;
    local_18 = local_18 + 1;
  }
  std::__cxx11::string::string((string *)this,(string *)(parse_modes + (long)local_18 * 0x28 + 8));
  return this;
}

Assistant:

static string FormatMode(Regexp::ParseFlags flags) {
  for (int i = 0; i < arraysize(parse_modes); i++)
    if (parse_modes[i].parse_flags == flags)
      return parse_modes[i].desc;
  return StringPrintf("%#x", static_cast<uint>(flags));
}